

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

char * __thiscall
CVmImageFileExt::alloc_mem(CVmImageFileExt *this,size_t siz,ulong remaining_in_page)

{
  undefined8 *puVar1;
  CVmImageFileExt_blk *this_00;
  ulong in_RSI;
  long in_RDI;
  size_t new_block_size;
  CVmImageFileExt_blk *new_block_1;
  CVmImageFileExt_blk *new_block;
  size_t in_stack_ffffffffffffff98;
  CVmImageFileExt_blk *in_stack_ffffffffffffffa0;
  char *local_8;
  
  if (in_RSI < 0x1fbe) {
    if ((*(long *)(in_RDI + 0x10) == 0) || (*(ulong *)(*(long *)(in_RDI + 0x10) + 0x18) < in_RSI)) {
      this_00 = (CVmImageFileExt_blk *)operator_new(0x28);
      CVmImageFileExt_blk::CVmImageFileExt_blk(this_00,in_stack_ffffffffffffff98);
      this_00->prv_ = (CVmImageFileExt_blk *)0x0;
      this_00->nxt_ = *(CVmImageFileExt_blk **)(in_RDI + 0x10);
      if (*(long *)(in_RDI + 0x10) == 0) {
        *(CVmImageFileExt_blk **)(in_RDI + 0x18) = this_00;
      }
      else {
        *(CVmImageFileExt_blk **)(*(long *)(in_RDI + 0x10) + 8) = this_00;
      }
      *(CVmImageFileExt_blk **)(in_RDI + 0x10) = this_00;
    }
    local_8 = CVmImageFileExt_blk::suballoc(*(CVmImageFileExt_blk **)(in_RDI + 0x10),in_RSI);
  }
  else {
    puVar1 = (undefined8 *)operator_new(0x28);
    CVmImageFileExt_blk::CVmImageFileExt_blk(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *puVar1 = 0;
    puVar1[1] = *(undefined8 *)(in_RDI + 0x18);
    if (*(long *)(in_RDI + 0x18) == 0) {
      *(undefined8 **)(in_RDI + 0x10) = puVar1;
    }
    else {
      **(undefined8 **)(in_RDI + 0x18) = puVar1;
    }
    *(undefined8 **)(in_RDI + 0x18) = puVar1;
    local_8 = CVmImageFileExt_blk::suballoc(*(CVmImageFileExt_blk **)(in_RDI + 0x18),in_RSI);
  }
  return local_8;
}

Assistant:

char *CVmImageFileExt::alloc_mem(size_t siz, ulong remaining_in_page)
{
    /* 
     *   If the requested size is more than an eigth of our block size,
     *   give the new allocation its own block.  Our blocks are intended
     *   to reduce overhead for small blocks; large blocks not only won't
     *   create a lot of overhead as individual "malloc" allocations, but
     *   would probably leave our block underutilized by leaving a lot of
     *   it free, defeating the purpose. 
     */
    if (siz > VMIMAGE_EXT_BLK_SIZE / 8)
    {
        CVmImageFileExt_blk *new_block;

        /* it's a big request, so give it its own block */
        new_block = new CVmImageFileExt_blk(siz);

        /* 
         *   link it at the tail of the list (we don't want to suballocate
         *   anything more out of this, obviously, since we're going to
         *   consume the entire block, but we do want to keep it in our
         *   list so that we can track and eventually delete the memory) 
         */
        new_block->nxt_ = 0;
        new_block->prv_ = mem_tail_;

        /* set the forward pointer of the previous entry */
        if (mem_tail_ != 0)
            mem_tail_->nxt_ = new_block;
        else
            mem_head_ = new_block;

        /* it's the new tail */
        mem_tail_ = new_block;

        /* "suballocate" out of the new block */
        return mem_tail_->suballoc(siz);
    }
    else
    {
        /* 
         *   It's a small request, so suballocate it out of a block.
         *   First, make sure we have space in the current block; if not,
         *   allocate a new block. 
         */
        if (mem_head_ == 0 || siz > mem_head_->rem_)
        {
            CVmImageFileExt_blk *new_block;
            size_t new_block_size;
            
            /* 
             *   There's no space left in the current block - allocate a new
             *   block.  Leave space in the new block for further
             *   allocations, so we don't have to allocate lots of little
             *   blocks; however, as an upper bound, allocate only as much
             *   space as remains in the current page being read out of the
             *   image file, so that we don't leave a bunch of unused space
             *   after reading the last objects from the image.  
             */
            new_block_size = VMIMAGE_EXT_BLK_SIZE;
            if (new_block_size > remaining_in_page)
                new_block_size = (size_t)remaining_in_page;

            /* allocate the new block */
            new_block = new CVmImageFileExt_blk(new_block_size);

            /* link it in at the head of our list */
            new_block->prv_ = 0;
            new_block->nxt_ = mem_head_;

            /* set the back pointer of the next entry */
            if (mem_head_ != 0)
                mem_head_->prv_ = new_block;
            else
                mem_tail_ = new_block;

            /* it's the new head */
            mem_head_ = new_block;
        }

        /* suballocate it */
        return mem_head_->suballoc(siz);
    }
}